

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall embree::Camera::dolly(Camera *this,float ds)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar5 = powf(0.99,ds);
  fVar1 = (this->from).field_0.m128[0];
  fVar2 = (this->from).field_0.m128[1];
  fVar3 = (this->from).field_0.m128[2];
  fVar4 = (this->from).field_0.m128[3];
  fVar8 = (this->to).field_0.m128[0] - fVar1;
  fVar9 = (this->to).field_0.m128[1] - fVar2;
  fVar10 = (this->to).field_0.m128[2] - fVar3;
  fVar11 = (this->to).field_0.m128[3] - fVar4;
  fVar12 = fVar9 * fVar9;
  fVar13 = fVar10 * fVar10;
  fVar14 = fVar11 * fVar11;
  fVar15 = fVar12 + fVar8 * fVar8 + fVar13;
  fVar16 = fVar12 + fVar12 + fVar14;
  fVar13 = fVar12 + fVar13 + fVar13;
  fVar14 = fVar12 + fVar14 + fVar14;
  fVar12 = (1.0 - fVar5) * SQRT(fVar15);
  auVar6._4_4_ = fVar16;
  auVar6._0_4_ = fVar15;
  auVar6._8_4_ = fVar13;
  auVar6._12_4_ = fVar14;
  auVar7._4_4_ = fVar16;
  auVar7._0_4_ = fVar15;
  auVar7._8_4_ = fVar13;
  auVar7._12_4_ = fVar14;
  auVar7 = rsqrtss(auVar6,auVar7);
  fVar5 = auVar7._0_4_;
  fVar5 = fVar5 * fVar5 * fVar15 * -0.5 * fVar5 + fVar5 * 1.5;
  (this->from).field_0.m128[0] = fVar12 * fVar5 * fVar8 + fVar1;
  (this->from).field_0.m128[1] = fVar12 * fVar5 * fVar9 + fVar2;
  (this->from).field_0.m128[2] = fVar12 * fVar5 * fVar10 + fVar3;
  (this->from).field_0.m128[3] = fVar12 * fVar5 * fVar11 + fVar4;
  return;
}

Assistant:

void dolly (float ds)
    {
      float dollySpeed = 0.01f;
      float k = powf((1.0f-dollySpeed), ds);
      from += length(to-from) * (1-k) * normalize(to-from);
    }